

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  uint uVar3;
  Message *pMVar4;
  ostream *poVar5;
  int exit_code;
  string local_2e8;
  GTestLog local_2c4;
  string local_2c0;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  ostringstream local_240 [8];
  ostringstream stream;
  string local_c8;
  string local_a8;
  string local_88;
  char *local_68 [3];
  Message local_50;
  Message buffer;
  undefined1 local_40 [7];
  bool success;
  string error_message;
  bool status_ok_local;
  DeathTestImpl *this_local;
  
  error_message.field_2._M_local_buf[0xf] = status_ok;
  bVar1 = spawned(this);
  if (bVar1) {
    (*(this->super_DeathTest)._vptr_DeathTest[6])(local_40);
    buffer.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._7_1_ = 0;
    Message::Message(&local_50);
    pMVar4 = Message::operator<<(&local_50,(char (*) [13])"Death test: ");
    local_68[0] = statement(this);
    pMVar4 = Message::operator<<(pMVar4,local_68);
    Message::operator<<(pMVar4,(char (*) [2])0x1977eb);
    DVar2 = outcome(this);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog(&local_2c4,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/build_O0/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                         ,0x265);
      poVar5 = GTestLog::GetStream(&local_2c4);
      std::operator<<(poVar5,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog(&local_2c4);
      break;
    case DIED:
      if ((error_message.field_2._M_local_buf[0xf] & 1U) == 0) {
        pMVar4 = Message::operator<<(&local_50,
                                     (char (*) [51])
                                     "    Result: died but not with expected exit code:\n");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"            ");
        uVar3 = status(this);
        ExitSummary_abi_cxx11_(&local_2a0,(internal *)(ulong)uVar3,exit_code);
        pMVar4 = Message::operator<<(pMVar4,&local_2a0);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x1977eb);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
        FormatDeathTestOutput(&local_2c0,(string *)local_40);
        Message::operator<<(pMVar4,&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      else {
        bVar1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::Matches(&(this->matcher_).
                           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
        if (bVar1) {
          buffer.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._7_1_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_240);
          MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::DescribeTo(&(this->matcher_).
                        super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                       ,(ostream *)local_240);
          pMVar4 = Message::operator<<(&local_50,
                                       (char (*) [47])
                                       "    Result: died but not with expected error.\n");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"  Expected: ");
          std::__cxx11::ostringstream::str();
          pMVar4 = Message::operator<<(pMVar4,&local_260);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x1977eb);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
          FormatDeathTestOutput(&local_280,(string *)local_40);
          Message::operator<<(pMVar4,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::ostringstream::~ostringstream(local_240);
        }
      }
      break;
    case LIVED:
      pMVar4 = Message::operator<<(&local_50,(char (*) [28])"    Result: failed to die.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_88,(string *)local_40);
      Message::operator<<(pMVar4,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      break;
    case RETURNED:
      pMVar4 = Message::operator<<(&local_50,
                                   (char (*) [47])"    Result: illegal return in test statement.\n")
      ;
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_c8,(string *)local_40);
      Message::operator<<(pMVar4,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      break;
    case THREW:
      pMVar4 = Message::operator<<(&local_50,(char (*) [33])"    Result: threw an exception.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_a8,(string *)local_40);
      Message::operator<<(pMVar4,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    Message::GetString_abi_cxx11_(&local_2e8,&local_50);
    DeathTest::set_last_death_test_message(&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    this_local._7_1_ =
         (bool)(buffer.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._7_1_ & 1);
    Message::~Message(&local_50);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}